

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O0

void __thiscall Room::parseData(Room *this)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  string local_250 [8];
  string line;
  int local_21c;
  istream local_218 [4];
  description description;
  ifstream myfile;
  Room *this_local;
  
  std::ifstream::ifstream(local_218,(string *)&this->roomName,_S_in);
  local_21c = 0;
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::string(local_250);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_250);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_250,"#ROOM_STATE_1#");
      if (bVar2) {
        local_21c = 1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_250,"#ROOM_STATE_2#");
        if (bVar2) {
          local_21c = 2;
        }
        else if (local_21c == 0) {
          std::__cxx11::string::operator+=((string *)&this->rstate0,local_250);
          std::__cxx11::string::operator+=((string *)&this->rstate0,"\n");
        }
        else if (local_21c == 1) {
          std::__cxx11::string::operator+=((string *)&this->rstate1,local_250);
          std::__cxx11::string::operator+=((string *)&this->rstate1,"\n");
        }
        else if (local_21c == 2) {
          std::__cxx11::string::operator+=((string *)&this->rstate2,local_250);
          std::__cxx11::string::operator+=((string *)&this->rstate2,"\n");
        }
      }
    }
    std::__cxx11::string::~string(local_250);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void Room::parseData() {
    std::ifstream myfile(roomName);
    description description = ROOM_STATE_0;
    if (myfile.is_open()) {
        std::string line;
        while (getline(myfile, line)) {
            if (line == "#ROOM_STATE_1#") {
                description = ROOM_STATE_1;
            } else if (line == "#ROOM_STATE_2#") {
                description = ROOM_STATE_2;
            } else if (description == ROOM_STATE_0) {
                rstate0 += line;
                rstate0 += "\n";
            } else if (description == ROOM_STATE_1) {
                rstate1 += line;
                rstate1 += "\n";
            } else if(description == ROOM_STATE_2) {
                rstate2 += line;
                rstate2 += "\n";
            }
        }
    }
    myfile.close();
}